

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_lua_generator.cc
# Opt level: O2

void __thiscall
t_lua_generator::generate_lua_struct_definition
          (t_lua_generator *this,ostream *out,t_struct *tstruct,bool is_exception)

{
  int *piVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined3 in_register_00000009;
  pointer pptVar4;
  string local_50;
  
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  std::operator<<(poVar3,(string *)CONCAT44(extraout_var,iVar2));
  if (CONCAT31(in_register_00000009,is_exception) == 0) {
    poVar3 = std::operator<<(out," = __TObject:new{");
  }
  else {
    poVar3 = std::operator<<(out," = TException:new{");
    poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_50,(t_generator *)this);
    poVar3 = std::operator<<(poVar3,(string *)&local_50);
    poVar3 = std::operator<<(poVar3,"  __type = \'");
    iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var_00,iVar2));
    std::operator<<(poVar3,"\'");
    std::__cxx11::string::~string((string *)&local_50);
    poVar3 = out;
    if ((tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      std::operator<<(out,",");
    }
  }
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  pptVar4 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  while (pptVar4 !=
         (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
         super__Vector_impl_data._M_finish) {
    t_generator::indent((t_generator *)this,out);
    std::operator<<(out,(string *)&(*pptVar4)->name_);
    pptVar4 = pptVar4 + 1;
    if (pptVar4 !=
        (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      poVar3 = std::operator<<(out,",");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    }
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(out,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,"}");
  generate_lua_struct_reader(this,out,tstruct);
  generate_lua_struct_writer(this,out,tstruct);
  return;
}

Assistant:

void t_lua_generator::generate_lua_struct_definition(ostream& out,
                                                     t_struct* tstruct,
                                                     bool is_exception) {
  vector<t_field*>::const_iterator m_iter;
  const vector<t_field*>& members = tstruct->get_members();

  indent(out) << endl << endl << tstruct->get_name();
  if (is_exception) {
    out << " = TException:new{" << endl << indent() << "  __type = '" << tstruct->get_name() << "'";
    if (members.size() > 0) {
      out << ",";
    }
    out << endl;
  } else {
    out << " = __TObject:new{" << endl;
  }
  indent_up();
  for (m_iter = members.begin(); m_iter != members.end();) {
    indent(out);
    out << (*m_iter)->get_name();
    ++m_iter;
    if (m_iter != members.end()) {
      out << "," << endl;
    }
  }
  indent_down();
  indent(out);
  out << endl << "}";

  generate_lua_struct_reader(out, tstruct);
  generate_lua_struct_writer(out, tstruct);
}